

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::SPxMainSM<double>::duplicateCols(SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  double dVar1;
  SPxOut *pSVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  DuplicateColsPS *pDVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Verbosity VVar10;
  int *piVar11;
  double *pdVar12;
  char *pcVar13;
  DSVectorBase<double> *pDVar14;
  element_type *peVar15;
  bool *pbVar16;
  SVectorBase<double> *pSVar17;
  ulong *puVar18;
  undefined8 *puVar19;
  int __c;
  int __c_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  undefined1 *in_RDX;
  DuplicateColsPS *in_RSI;
  SPxMainSM<double> *in_RDI;
  Real eps;
  Verbosity old_verbosity;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr_6;
  int j_5;
  DataArray<int> da_perm;
  int j_4;
  int j_3;
  int *perm;
  int nColsOld;
  int j_2;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr_5;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr_4;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr_3;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr_2;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr_1;
  double objDif;
  double factor;
  double cj2;
  double cj1;
  int j2;
  int j1;
  int m_1;
  int l_1;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  int k_4;
  DataArray<int> m_perm_empty;
  bool hasDuplicateCol;
  int k_3;
  int k_2;
  DataArray<bool> fixAndRemCol;
  DataArray<bool> remCol;
  int l;
  int classIdx;
  ElementCompare compare;
  int k_1;
  int m;
  int j_1;
  double aij;
  int k;
  SVectorBase<double> *row;
  int i;
  double oldVal;
  int j;
  IdxSet idxSet;
  SPxMemoryException *x;
  int *idxMem;
  Array<double> scale;
  DataArray<int> classSize;
  DataArray<int> pClass;
  Result ret;
  int remNzos;
  int remCols;
  undefined4 in_stack_fffffffffffff628;
  int in_stack_fffffffffffff62c;
  undefined4 in_stack_fffffffffffff630;
  undefined4 in_stack_fffffffffffff634;
  int in_stack_fffffffffffff638;
  int in_stack_fffffffffffff63c;
  DSVectorBase<double> *in_stack_fffffffffffff640;
  SPxMainSM<double> *in_stack_fffffffffffff650;
  undefined8 in_stack_fffffffffffff658;
  ElementCompare *in_stack_fffffffffffff660;
  undefined8 in_stack_fffffffffffff668;
  int n;
  Nonzero<double> *in_stack_fffffffffffff670;
  double *in_stack_fffffffffffff6c0;
  undefined2 uVar20;
  DuplicateColsPS *in_stack_fffffffffffff6c8;
  undefined4 in_stack_fffffffffffff6d0;
  int in_stack_fffffffffffff6d4;
  double *in_stack_fffffffffffff6d8;
  double in_stack_fffffffffffff6e0;
  SPxLPBase<double> *in_stack_fffffffffffff6e8;
  DuplicateColsPS *in_stack_fffffffffffff6f0;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffff740;
  undefined1 *in_stack_fffffffffffff748;
  DuplicateColsPS *in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff758;
  int in_stack_fffffffffffff75c;
  FixBoundsPS *in_stack_fffffffffffff760;
  double *in_stack_fffffffffffff770;
  SPxLPBase<double> *in_stack_fffffffffffff778;
  SPxMainSM<double> *in_stack_fffffffffffff780;
  SPxLPBase<double> *in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7cc;
  bool local_572;
  undefined4 local_3f4;
  Verbosity local_3f0;
  undefined1 local_3e9;
  int local_3ac;
  DataArray<int> local_3a8;
  int local_390;
  int local_38c;
  long local_388;
  int local_37c;
  int local_378;
  undefined1 local_371;
  undefined1 local_370 [176];
  double local_2c0;
  int *local_2b8;
  double local_2b0;
  _func_int **local_2a8;
  double local_2a0;
  Nonzero<double> *local_298;
  undefined1 local_289;
  byte local_249;
  byte local_231;
  byte local_219;
  double local_1f8;
  int *local_1f0;
  double local_1e8;
  double local_1e0;
  int local_1d4;
  int local_1d0;
  uint local_1cc;
  uint local_1c8;
  undefined1 local_1c1;
  int local_188;
  int local_184;
  byte local_161;
  undefined8 local_160;
  int local_158;
  int local_154;
  DataArray<bool> local_150;
  DataArray<bool> local_138;
  uint local_120;
  int local_11c;
  ElementCompare local_108;
  int local_100;
  uint local_fc;
  double local_f8;
  int local_ec;
  double local_e8;
  uint local_dc;
  SVectorBase<double> *local_d8;
  int local_cc;
  double local_c8;
  int local_bc;
  IdxSet local_b8;
  int *local_90;
  DataArray<int> local_60;
  DataArray<int> local_48;
  Result local_2c;
  int local_28;
  int local_24;
  undefined1 *local_20;
  DuplicateColsPS *local_18;
  Result local_4;
  
  local_24 = 0;
  local_28 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_2c = removeEmpty((SPxMainSM<double> *)
                         CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                         in_stack_fffffffffffff7c0);
  local_4 = local_2c;
  if (local_2c == OKAY) {
    iVar8 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x277803);
    if (iVar8 < 2) {
      local_4 = OKAY;
    }
    else {
      SPxLPBase<double>::nCols((SPxLPBase<double> *)0x277825);
      DataArray<int>::DataArray
                ((DataArray<int> *)in_stack_fffffffffffff640,in_stack_fffffffffffff63c,
                 in_stack_fffffffffffff638,
                 (Real)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      SPxLPBase<double>::nCols((SPxLPBase<double> *)0x27784b);
      DataArray<int>::DataArray
                ((DataArray<int> *)in_stack_fffffffffffff640,in_stack_fffffffffffff63c,
                 in_stack_fffffffffffff638,
                 (Real)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      SPxLPBase<double>::nCols((SPxLPBase<double> *)0x277881);
      Array<double>::Array((Array<double> *)in_stack_fffffffffffff640,in_stack_fffffffffffff63c);
      local_90 = (int *)0x0;
      SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2778b9);
      spx_alloc<int*>((int **)in_stack_fffffffffffff670,
                      (int)((ulong)in_stack_fffffffffffff668 >> 0x20));
      iVar8 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2779f0);
      IdxSet::IdxSet(&local_b8,iVar8,local_90,0);
      piVar11 = DataArray<int>::operator[](&local_48,0);
      *piVar11 = 0;
      pdVar12 = Array<double>::operator[]
                          ((Array<double> *)
                           CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                           in_stack_fffffffffffff62c);
      *pdVar12 = 0.0;
      iVar8 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x277a5d);
      piVar11 = DataArray<int>::operator[](&local_60,0);
      *piVar11 = iVar8;
      for (local_bc = 1; iVar8 = local_bc,
          iVar9 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x277aa4), iVar8 < iVar9;
          local_bc = local_bc + 1) {
        piVar11 = DataArray<int>::operator[](&local_48,local_bc);
        *piVar11 = 0;
        pdVar12 = Array<double>::operator[]
                            ((Array<double> *)
                             CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                             in_stack_fffffffffffff62c);
        *pdVar12 = 0.0;
        piVar11 = DataArray<int>::operator[](&local_60,local_bc);
        *piVar11 = 0;
        IdxSet::addIdx(&local_b8,local_bc);
      }
      local_c8 = 0.0;
      for (local_cc = 0; iVar8 = local_cc,
          iVar9 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x277ba0), iVar8 < iVar9;
          local_cc = local_cc + 1) {
        local_d8 = SPxLPBase<double>::rowVector
                             ((SPxLPBase<double> *)
                              CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                              in_stack_fffffffffffff62c);
        for (local_dc = 0; uVar5 = local_dc, iVar8 = SVectorBase<double>::size(local_d8),
            (int)uVar5 < iVar8; local_dc = local_dc + 1) {
          pdVar12 = SVectorBase<double>::value(local_d8,local_dc);
          local_e8 = *pdVar12;
          pcVar13 = SVectorBase<double>::index(local_d8,(char *)(ulong)local_dc,__c);
          local_ec = (int)pcVar13;
          pdVar12 = Array<double>::operator[]
                              ((Array<double> *)
                               CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                               in_stack_fffffffffffff62c);
          dVar1 = local_e8;
          if ((*pdVar12 == 0.0) && (!NAN(*pdVar12))) {
            pdVar12 = Array<double>::operator[]
                                ((Array<double> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                 in_stack_fffffffffffff62c);
            *pdVar12 = dVar1;
          }
          DataArray<int>::operator[](&local_48,local_ec);
          Array<soplex::DSVectorBase<double>_>::operator[]
                    ((Array<soplex::DSVectorBase<double>_> *)
                     CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                     in_stack_fffffffffffff62c);
          dVar1 = local_e8;
          pdVar12 = Array<double>::operator[]
                              ((Array<double> *)
                               CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                               in_stack_fffffffffffff62c);
          local_f8 = dVar1 / *pdVar12;
          DSVectorBase<double>::add
                    (in_stack_fffffffffffff640,in_stack_fffffffffffff63c,
                     (double *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
          piVar11 = DataArray<int>::operator[](&local_48,local_ec);
          piVar11 = DataArray<int>::operator[](&local_60,*piVar11);
          iVar8 = *piVar11;
          *piVar11 = iVar8 + -1;
          if (iVar8 + -1 == 0) {
            piVar11 = DataArray<int>::operator[](&local_48,local_ec);
            IdxSet::addIdx(&local_b8,*piVar11);
          }
        }
        for (local_fc = 0; uVar5 = local_fc, iVar8 = SVectorBase<double>::size(local_d8),
            (int)uVar5 < iVar8; local_fc = local_fc + 1) {
          pcVar13 = SVectorBase<double>::index(local_d8,(char *)(ulong)local_fc,__c_00);
          piVar11 = DataArray<int>::operator[](&local_48,(int)pcVar13);
          local_100 = *piVar11;
          pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                              ((Array<soplex::DSVectorBase<double>_> *)
                               CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                               in_stack_fffffffffffff62c);
          iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
          if (0 < iVar8) {
            SPxSimplifier<double>::tolerances
                      ((SPxSimplifier<double> *)
                       CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
            peVar15 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x277e86);
            eps = Tolerances::epsilon(peVar15);
            ElementCompare::ElementCompare(&local_108,eps);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x277ebe);
            pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                ((Array<soplex::DSVectorBase<double>_> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                 in_stack_fffffffffffff62c);
            iVar9 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
            iVar8 = extraout_EDX;
            if (1 < iVar9) {
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   in_stack_fffffffffffff62c);
              SVectorBase<double>::mem(&pDVar14->super_SVectorBase<double>);
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   in_stack_fffffffffffff62c);
              SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
              SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                        (in_stack_fffffffffffff670,(int)((ulong)in_stack_fffffffffffff668 >> 0x20),
                         in_stack_fffffffffffff660,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffff658 >> 0x18,0));
              iVar8 = extraout_EDX_00;
            }
            pcVar13 = IdxSet::index(&local_b8,(char *)0x0,iVar8);
            local_11c = (int)pcVar13;
            IdxSet::remove(&local_b8,(char *)0x0);
            local_120 = 0;
            while( true ) {
              uVar5 = local_120;
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   in_stack_fffffffffffff62c);
              iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
              if (iVar8 <= (int)uVar5) break;
              if (local_120 != 0) {
                pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                    ((Array<soplex::DSVectorBase<double>_> *)
                                     CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                     in_stack_fffffffffffff62c);
                SVectorBase<double>::value(&pDVar14->super_SVectorBase<double>,local_120);
                epsZero(in_stack_fffffffffffff650);
                bVar7 = NErel<double,double,double>
                                  ((double)CONCAT44(in_stack_fffffffffffff634,
                                                    in_stack_fffffffffffff630),
                                   (double)CONCAT44(in_stack_fffffffffffff62c,
                                                    in_stack_fffffffffffff628),1.27904850746367e-317
                                  );
                if (bVar7) {
                  pcVar13 = IdxSet::index(&local_b8,(char *)0x0,__c_01);
                  local_11c = (int)pcVar13;
                  IdxSet::remove(&local_b8,(char *)0x0);
                }
              }
              iVar8 = local_11c;
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   in_stack_fffffffffffff62c);
              piVar11 = (int *)SVectorBase<double>::index
                                         (&pDVar14->super_SVectorBase<double>,
                                          (char *)(ulong)local_120,__c_02);
              piVar11 = DataArray<int>::operator[](&local_48,*piVar11);
              *piVar11 = iVar8;
              piVar11 = DataArray<int>::operator[](&local_60,local_11c);
              *piVar11 = *piVar11 + 1;
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   in_stack_fffffffffffff62c);
              pdVar12 = SVectorBase<double>::value(&pDVar14->super_SVectorBase<double>,local_120);
              local_c8 = *pdVar12;
              local_120 = local_120 + 1;
            }
            Array<soplex::DSVectorBase<double>_>::operator[]
                      ((Array<soplex::DSVectorBase<double>_> *)
                       CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                       in_stack_fffffffffffff62c);
            SVectorBase<double>::clear((SVectorBase<double> *)0x2781b9);
          }
        }
      }
      spx_free<int*>((int **)0x2781f6);
      SPxLPBase<double>::nCols((SPxLPBase<double> *)0x278203);
      DataArray<bool>::DataArray
                ((DataArray<bool> *)in_stack_fffffffffffff640,in_stack_fffffffffffff63c,
                 in_stack_fffffffffffff638,
                 (Real)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      SPxLPBase<double>::nCols((SPxLPBase<double> *)0x278239);
      DataArray<bool>::DataArray
                ((DataArray<bool> *)in_stack_fffffffffffff640,in_stack_fffffffffffff63c,
                 in_stack_fffffffffffff638,
                 (Real)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      for (local_154 = 0; iVar8 = local_154,
          iVar9 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x278288), iVar8 < iVar9;
          local_154 = local_154 + 1) {
        Array<soplex::DSVectorBase<double>_>::operator[]
                  ((Array<soplex::DSVectorBase<double>_> *)
                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                   in_stack_fffffffffffff62c);
        SVectorBase<double>::clear((SVectorBase<double> *)0x2782ca);
      }
      for (local_158 = 0; iVar8 = local_158,
          iVar9 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x278335), iVar8 < iVar9;
          local_158 = local_158 + 1) {
        pbVar16 = DataArray<bool>::operator[](&local_138,local_158);
        *pbVar16 = false;
        pbVar16 = DataArray<bool>::operator[](&local_150,local_158);
        *pbVar16 = false;
        DataArray<int>::operator[](&local_48,local_158);
        Array<soplex::DSVectorBase<double>_>::operator[]
                  ((Array<soplex::DSVectorBase<double>_> *)
                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                   in_stack_fffffffffffff62c);
        local_160 = 0;
        DSVectorBase<double>::add
                  (in_stack_fffffffffffff640,in_stack_fffffffffffff63c,
                   (double *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      }
      local_161 = 0;
      DataArray<int>::DataArray
                ((DataArray<int> *)in_stack_fffffffffffff640,in_stack_fffffffffffff63c,
                 in_stack_fffffffffffff638,
                 (Real)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      for (local_184 = 0; iVar8 = local_184,
          iVar9 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x278444), iVar8 < iVar9;
          local_184 = local_184 + 1) {
        pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                            ((Array<soplex::DSVectorBase<double>_> *)
                             CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                             in_stack_fffffffffffff62c);
        iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
        if (1 < iVar8) {
          pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                              ((Array<soplex::DSVectorBase<double>_> *)
                               CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                               in_stack_fffffffffffff62c);
          SVectorBase<double>::index(&pDVar14->super_SVectorBase<double>,(char *)0x0,__c_03);
          pSVar17 = SPxLPBase<double>::colVector
                              ((SPxLPBase<double> *)
                               CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                               in_stack_fffffffffffff62c);
          iVar8 = SVectorBase<double>::size(pSVar17);
          if (iVar8 != 1) {
            pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                ((Array<soplex::DSVectorBase<double>_> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                 in_stack_fffffffffffff62c);
            local_188 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
            SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[37],_int,_0>
                      (in_RDI,(char (*) [37])"IMAISM58 {} duplicate columns found\n",&local_188);
            if ((local_161 & 1) == 0) {
              operator_new(0x78);
              local_1c1 = 1;
              DataArray<int>::DataArray
                        ((DataArray<int> *)in_stack_fffffffffffff640,
                         (DataArray<int> *)
                         CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
              std::shared_ptr<soplex::Tolerances>::shared_ptr
                        ((shared_ptr<soplex::Tolerances> *)
                         CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                         (shared_ptr<soplex::Tolerances> *)
                         CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
              in_stack_fffffffffffff630 = 0;
              in_stack_fffffffffffff628 = 1;
              DuplicateColsPS::DuplicateColsPS
                        (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                         (int)((ulong)in_stack_fffffffffffff6e0 >> 0x20),
                         SUB84(in_stack_fffffffffffff6e0,0),(double)in_stack_fffffffffffff6d8,
                         (DataArray<int> *)
                         CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),
                         (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff6c8,
                         SUB81((ulong)in_stack_fffffffffffff6c0 >> 0x38,0),
                         SUB81((ulong)in_stack_fffffffffffff6c0 >> 0x30,0));
              local_1c1 = 0;
              std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
              shared_ptr<soplex::SPxMainSM<double>::DuplicateColsPS,void>
                        ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                         CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                         (DuplicateColsPS *)
                         CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
              std::shared_ptr<soplex::Tolerances>::~shared_ptr
                        ((shared_ptr<soplex::Tolerances> *)0x278628);
              DataArray<int>::~DataArray
                        ((DataArray<int> *)
                         CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
              Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                        ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
                         CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                         (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                         CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
              local_161 = 1;
              std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                        ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x278668);
            }
            local_1c8 = 0;
            while( true ) {
              uVar5 = local_1c8;
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   in_stack_fffffffffffff62c);
              iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
              if (iVar8 <= (int)uVar5) break;
              local_1cc = 0;
              while( true ) {
                uVar5 = local_1cc;
                pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                    ((Array<soplex::DSVectorBase<double>_> *)
                                     CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                     in_stack_fffffffffffff62c);
                iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
                if (iVar8 <= (int)uVar5) break;
                pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                    ((Array<soplex::DSVectorBase<double>_> *)
                                     CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                     in_stack_fffffffffffff62c);
                piVar11 = (int *)SVectorBase<double>::index
                                           (&pDVar14->super_SVectorBase<double>,
                                            (char *)(ulong)local_1c8,__c_04);
                local_1d0 = *piVar11;
                pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                    ((Array<soplex::DSVectorBase<double>_> *)
                                     CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                     in_stack_fffffffffffff62c);
                piVar11 = (int *)SVectorBase<double>::index
                                           (&pDVar14->super_SVectorBase<double>,
                                            (char *)(ulong)local_1cc,__c_05);
                local_1d4 = *piVar11;
                if (((local_1c8 != local_1cc) &&
                    (pbVar16 = DataArray<bool>::operator[](&local_138,local_1d0),
                    (*pbVar16 & 1U) == 0)) &&
                   (pbVar16 = DataArray<bool>::operator[](&local_138,local_1d4),
                   (*pbVar16 & 1U) == 0)) {
                  pdVar12 = SPxLPBase<double>::maxObj
                                      ((SPxLPBase<double> *)
                                       CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                                       ,in_stack_fffffffffffff62c);
                  local_1e0 = *pdVar12;
                  pdVar12 = SPxLPBase<double>::maxObj
                                      ((SPxLPBase<double> *)
                                       CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                                       ,in_stack_fffffffffffff62c);
                  local_1e8 = *pdVar12;
                  pdVar12 = Array<double>::operator[]
                                      ((Array<double> *)
                                       CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                                       ,in_stack_fffffffffffff62c);
                  dVar1 = *pdVar12;
                  pdVar12 = Array<double>::operator[]
                                      ((Array<double> *)
                                       CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                                       ,in_stack_fffffffffffff62c);
                  dVar4 = local_1e0;
                  dVar3 = local_1e8;
                  local_1f0 = (int *)(dVar1 / *pdVar12);
                  pdVar12 = Array<double>::operator[]
                                      ((Array<double> *)
                                       CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                                       ,in_stack_fffffffffffff62c);
                  dVar1 = *pdVar12;
                  pdVar12 = Array<double>::operator[]
                                      ((Array<double> *)
                                       CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                                       ,in_stack_fffffffffffff62c);
                  local_1f8 = dVar4 - (dVar3 * dVar1) / *pdVar12;
                  epsZero(in_stack_fffffffffffff650);
                  bVar7 = isZero<double,double>
                                    ((double)CONCAT44(in_stack_fffffffffffff634,
                                                      in_stack_fffffffffffff630),
                                     (double)CONCAT44(in_stack_fffffffffffff62c,
                                                      in_stack_fffffffffffff628));
                  if (bVar7) {
                    local_219 = 0;
                    local_231 = 0;
                    local_249 = 0;
                    SPxLPBase<double>::lower
                              ((SPxLPBase<double> *)
                               CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                               in_stack_fffffffffffff62c);
                    SPxSimplifier<double>::tolerances
                              ((SPxSimplifier<double> *)
                               CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                    peVar15 = std::
                              __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x278a56);
                    Tolerances::epsilon(peVar15);
                    bVar7 = LErel<double,double,double>
                                      ((double)CONCAT44(in_stack_fffffffffffff634,
                                                        in_stack_fffffffffffff630),
                                       (double)CONCAT44(in_stack_fffffffffffff62c,
                                                        in_stack_fffffffffffff628),
                                       1.28030343420411e-317);
                    local_572 = false;
                    if (bVar7) {
                      SPxLPBase<double>::upper
                                ((SPxLPBase<double> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                 in_stack_fffffffffffff62c);
                      SPxSimplifier<double>::tolerances
                                ((SPxSimplifier<double> *)
                                 CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                      local_219 = 1;
                      peVar15 = std::
                                __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x278b0b);
                      Tolerances::epsilon(peVar15);
                      bVar7 = GErel<double,double,double>
                                        ((double)CONCAT44(in_stack_fffffffffffff634,
                                                          in_stack_fffffffffffff630),
                                         (double)CONCAT44(in_stack_fffffffffffff62c,
                                                          in_stack_fffffffffffff628),
                                         1.28039286008601e-317);
                      local_572 = false;
                      if (bVar7) {
                        SPxLPBase<double>::lower
                                  ((SPxLPBase<double> *)
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   in_stack_fffffffffffff62c);
                        SPxSimplifier<double>::tolerances
                                  ((SPxSimplifier<double> *)
                                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                        local_231 = 1;
                        peVar15 = std::
                                  __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)0x278bc0);
                        Tolerances::epsilon(peVar15);
                        bVar7 = LErel<double,double,double>
                                          ((double)CONCAT44(in_stack_fffffffffffff634,
                                                            in_stack_fffffffffffff630),
                                           (double)CONCAT44(in_stack_fffffffffffff62c,
                                                            in_stack_fffffffffffff628),
                                           1.2804822859679e-317);
                        local_572 = false;
                        if (bVar7) {
                          SPxLPBase<double>::upper
                                    ((SPxLPBase<double> *)
                                     CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                     in_stack_fffffffffffff62c);
                          SPxSimplifier<double>::tolerances
                                    ((SPxSimplifier<double> *)
                                     CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                          local_249 = 1;
                          peVar15 = std::
                                    __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)0x278c75);
                          Tolerances::epsilon(peVar15);
                          local_572 = GErel<double,double,double>
                                                ((double)CONCAT44(in_stack_fffffffffffff634,
                                                                  in_stack_fffffffffffff630),
                                                 (double)CONCAT44(in_stack_fffffffffffff62c,
                                                                  in_stack_fffffffffffff628),
                                                 1.2805717118498e-317);
                        }
                      }
                    }
                    if ((local_249 & 1) != 0) {
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x278ce2);
                    }
                    if ((local_231 & 1) != 0) {
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x278cfb);
                    }
                    if ((local_219 & 1) != 0) {
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x278d14);
                    }
                    std::shared_ptr<soplex::Tolerances>::~shared_ptr
                              ((shared_ptr<soplex::Tolerances> *)0x278d21);
                    if (local_572 == false) {
                      SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[95],_int_&,_int_&,_0>
                                (in_RDI,(char (*) [95])
                                        "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n"
                                 ,&local_1d0,&local_1d4);
                    }
                    else {
                      operator_new(0x78);
                      local_289 = 1;
                      DataArray<int>::DataArray
                                ((DataArray<int> *)in_stack_fffffffffffff640,
                                 (DataArray<int> *)
                                 CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
                      std::shared_ptr<soplex::Tolerances>::shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                 (shared_ptr<soplex::Tolerances> *)
                                 CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                      in_stack_fffffffffffff630 = 0;
                      in_stack_fffffffffffff628 = 0;
                      DuplicateColsPS::DuplicateColsPS
                                (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                                 (int)((ulong)in_stack_fffffffffffff6e0 >> 0x20),
                                 SUB84(in_stack_fffffffffffff6e0,0),
                                 (double)in_stack_fffffffffffff6d8,
                                 (DataArray<int> *)
                                 CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),
                                 (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff6c8,
                                 SUB81((ulong)in_stack_fffffffffffff6c0 >> 0x38,0),
                                 SUB81((ulong)in_stack_fffffffffffff6c0 >> 0x30,0));
                      local_289 = 0;
                      std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
                      shared_ptr<soplex::SPxMainSM<double>::DuplicateColsPS,void>
                                ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                 (DuplicateColsPS *)
                                 CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x278e3d);
                      DataArray<int>::~DataArray
                                ((DataArray<int> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
                      Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                                ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                 (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                                 CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                      if ((double)local_1f0 <= 0.0) {
                        if ((double)local_1f0 < 0.0) {
                          pdVar12 = SPxLPBase<double>::lower
                                              ((SPxLPBase<double> *)
                                               CONCAT44(in_stack_fffffffffffff634,
                                                        in_stack_fffffffffffff630),
                                               in_stack_fffffffffffff62c);
                          dVar1 = *pdVar12;
                          pdVar12 = (double *)infinity();
                          if (dVar1 <= -*pdVar12) {
LAB_00279434:
                            pDVar6 = local_18;
                            iVar8 = local_1d4;
                            puVar18 = (ulong *)infinity();
                            local_2b8 = (int *)(*puVar18 ^ 0x8000000000000000);
                            (*(code *)((element_type *)(pDVar6->super_PostStep)._vptr_PostStep)[4].
                                      s_floating_point_feastol)(pDVar6,iVar8,&local_2b8,0);
                          }
                          else {
                            pdVar12 = SPxLPBase<double>::upper
                                                ((SPxLPBase<double> *)
                                                 CONCAT44(in_stack_fffffffffffff634,
                                                          in_stack_fffffffffffff630),
                                                 in_stack_fffffffffffff62c);
                            dVar1 = *pdVar12;
                            pdVar12 = (double *)infinity();
                            pDVar6 = local_18;
                            iVar8 = local_1d4;
                            if (*pdVar12 <= dVar1) goto LAB_00279434;
                            pdVar12 = SPxLPBase<double>::lower
                                                ((SPxLPBase<double> *)
                                                 CONCAT44(in_stack_fffffffffffff634,
                                                          in_stack_fffffffffffff630),
                                                 in_stack_fffffffffffff62c);
                            piVar11 = local_1f0;
                            dVar1 = *pdVar12;
                            pdVar12 = SPxLPBase<double>::upper
                                                ((SPxLPBase<double> *)
                                                 CONCAT44(in_stack_fffffffffffff634,
                                                          in_stack_fffffffffffff630),
                                                 in_stack_fffffffffffff62c);
                            local_2c0 = dVar1 + (double)piVar11 * *pdVar12;
                            (*(code *)((element_type *)(pDVar6->super_PostStep)._vptr_PostStep)[4].
                                      s_floating_point_feastol)(pDVar6,iVar8,&local_2c0,0);
                          }
                          pdVar12 = SPxLPBase<double>::upper
                                              ((SPxLPBase<double> *)
                                               CONCAT44(in_stack_fffffffffffff634,
                                                        in_stack_fffffffffffff630),
                                               in_stack_fffffffffffff62c);
                          dVar1 = *pdVar12;
                          pdVar12 = (double *)infinity();
                          if (dVar1 < *pdVar12) {
                            pdVar12 = SPxLPBase<double>::lower
                                                ((SPxLPBase<double> *)
                                                 CONCAT44(in_stack_fffffffffffff634,
                                                          in_stack_fffffffffffff630),
                                                 in_stack_fffffffffffff62c);
                            dVar1 = *pdVar12;
                            pdVar12 = (double *)infinity();
                            pDVar6 = local_18;
                            iVar8 = local_1d4;
                            if (-*pdVar12 < dVar1) {
                              pdVar12 = SPxLPBase<double>::upper
                                                  ((SPxLPBase<double> *)
                                                   CONCAT44(in_stack_fffffffffffff634,
                                                            in_stack_fffffffffffff630),
                                                   in_stack_fffffffffffff62c);
                              piVar11 = local_1f0;
                              dVar1 = *pdVar12;
                              pdVar12 = SPxLPBase<double>::lower
                                                  ((SPxLPBase<double> *)
                                                   CONCAT44(in_stack_fffffffffffff634,
                                                            in_stack_fffffffffffff630),
                                                   in_stack_fffffffffffff62c);
                              local_370._160_8_ = dVar1 + (double)piVar11 * *pdVar12;
                              (*(code *)((element_type *)(pDVar6->super_PostStep)._vptr_PostStep)[5]
                                        .s_epsilon)(pDVar6,iVar8,local_370 + 0xa0,0);
                              goto LAB_00279738;
                            }
                          }
                          pDVar6 = local_18;
                          iVar8 = local_1d4;
                          puVar19 = (undefined8 *)infinity();
                          local_370._168_8_ = *puVar19;
                          (*(code *)((element_type *)(pDVar6->super_PostStep)._vptr_PostStep)[5].
                                    s_epsilon)(pDVar6,iVar8,local_370 + 0xa8,0);
                        }
                      }
                      else {
                        pdVar12 = SPxLPBase<double>::lower
                                            ((SPxLPBase<double> *)
                                             CONCAT44(in_stack_fffffffffffff634,
                                                      in_stack_fffffffffffff630),
                                             in_stack_fffffffffffff62c);
                        dVar1 = *pdVar12;
                        pdVar12 = (double *)infinity();
                        if (dVar1 <= -*pdVar12) {
LAB_00278f46:
                          pDVar6 = local_18;
                          iVar8 = local_1d4;
                          puVar18 = (ulong *)infinity();
                          local_298 = (Nonzero<double> *)(*puVar18 ^ 0x8000000000000000);
                          (*(code *)((element_type *)(pDVar6->super_PostStep)._vptr_PostStep)[4].
                                    s_floating_point_feastol)(pDVar6,iVar8,&local_298,0);
                        }
                        else {
                          pdVar12 = SPxLPBase<double>::lower
                                              ((SPxLPBase<double> *)
                                               CONCAT44(in_stack_fffffffffffff634,
                                                        in_stack_fffffffffffff630),
                                               in_stack_fffffffffffff62c);
                          dVar1 = *pdVar12;
                          pdVar12 = (double *)infinity();
                          pDVar6 = local_18;
                          iVar8 = local_1d4;
                          if (dVar1 <= -*pdVar12) goto LAB_00278f46;
                          pdVar12 = SPxLPBase<double>::lower
                                              ((SPxLPBase<double> *)
                                               CONCAT44(in_stack_fffffffffffff634,
                                                        in_stack_fffffffffffff630),
                                               in_stack_fffffffffffff62c);
                          piVar11 = local_1f0;
                          dVar1 = *pdVar12;
                          pdVar12 = SPxLPBase<double>::lower
                                              ((SPxLPBase<double> *)
                                               CONCAT44(in_stack_fffffffffffff634,
                                                        in_stack_fffffffffffff630),
                                               in_stack_fffffffffffff62c);
                          local_2a0 = dVar1 + (double)piVar11 * *pdVar12;
                          (*(code *)((element_type *)(pDVar6->super_PostStep)._vptr_PostStep)[4].
                                    s_floating_point_feastol)(pDVar6,iVar8,&local_2a0,0);
                        }
                        pdVar12 = SPxLPBase<double>::upper
                                            ((SPxLPBase<double> *)
                                             CONCAT44(in_stack_fffffffffffff634,
                                                      in_stack_fffffffffffff630),
                                             in_stack_fffffffffffff62c);
                        dVar1 = *pdVar12;
                        pdVar12 = (double *)infinity();
                        if (dVar1 < *pdVar12) {
                          pdVar12 = SPxLPBase<double>::upper
                                              ((SPxLPBase<double> *)
                                               CONCAT44(in_stack_fffffffffffff634,
                                                        in_stack_fffffffffffff630),
                                               in_stack_fffffffffffff62c);
                          dVar1 = *pdVar12;
                          pdVar12 = (double *)infinity();
                          pDVar6 = local_18;
                          iVar8 = local_1d4;
                          if (dVar1 < *pdVar12) {
                            pdVar12 = SPxLPBase<double>::upper
                                                ((SPxLPBase<double> *)
                                                 CONCAT44(in_stack_fffffffffffff634,
                                                          in_stack_fffffffffffff630),
                                                 in_stack_fffffffffffff62c);
                            piVar11 = local_1f0;
                            dVar1 = *pdVar12;
                            pdVar12 = SPxLPBase<double>::upper
                                                ((SPxLPBase<double> *)
                                                 CONCAT44(in_stack_fffffffffffff634,
                                                          in_stack_fffffffffffff630),
                                                 in_stack_fffffffffffff62c);
                            local_2b0 = dVar1 + (double)piVar11 * *pdVar12;
                            (*(code *)((element_type *)(pDVar6->super_PostStep)._vptr_PostStep)[5].
                                      s_epsilon)(pDVar6,iVar8,&local_2b0,0);
                            goto LAB_00279738;
                          }
                        }
                        pDVar6 = local_18;
                        iVar8 = local_1d4;
                        puVar19 = (undefined8 *)infinity();
                        local_2a8 = (_func_int **)*puVar19;
                        (*(code *)((element_type *)(pDVar6->super_PostStep)._vptr_PostStep)[5].
                                  s_epsilon)(pDVar6,iVar8,&local_2a8,0);
                      }
LAB_00279738:
                      SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[55],_int_&,_int_&,_0>
                                (in_RDI,(char (*) [55])
                                        "IMAISM60 two duplicate columns {}, {} replaced by one\n",
                                 &local_1d0,&local_1d4);
                      pbVar16 = DataArray<bool>::operator[](&local_138,local_1d0);
                      *pbVar16 = true;
                      piVar11 = DataArray<int>::operator[](&in_RDI->m_stat,0xe);
                      *piVar11 = *piVar11 + 1;
                      std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                                ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x2797a2);
                    }
                  }
                  else {
                    pdVar12 = SPxLPBase<double>::lower
                                        ((SPxLPBase<double> *)
                                         CONCAT44(in_stack_fffffffffffff634,
                                                  in_stack_fffffffffffff630),
                                         in_stack_fffffffffffff62c);
                    dVar1 = *pdVar12;
                    pdVar12 = (double *)infinity();
                    if (-*pdVar12 < dVar1) {
                      pdVar12 = SPxLPBase<double>::upper
                                          ((SPxLPBase<double> *)
                                           CONCAT44(in_stack_fffffffffffff634,
                                                    in_stack_fffffffffffff630),
                                           in_stack_fffffffffffff62c);
                      dVar1 = *pdVar12;
                      pdVar12 = (double *)infinity();
                      if (*pdVar12 <= dVar1) {
                        if ((0.0 <= (double)local_1f0) || (local_1f8 <= 0.0)) {
                          if ((0.0 < (double)local_1f0) && (local_1f8 < 0.0)) {
                            pdVar12 = SPxLPBase<double>::lower
                                                ((SPxLPBase<double> *)
                                                 CONCAT44(in_stack_fffffffffffff634,
                                                          in_stack_fffffffffffff630),
                                                 in_stack_fffffffffffff62c);
                            dVar1 = *pdVar12;
                            pdVar12 = (double *)infinity();
                            if (dVar1 <= -*pdVar12) {
                              SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[23],_0>
                                        (in_RDI,(char (*) [23])"IMAISM78 LP unbounded\n");
                              local_4 = UNBOUNDED;
                              local_370._156_4_ = 1;
                              goto LAB_0027ab5c;
                            }
                            pdVar12 = SPxLPBase<double>::lower
                                                ((SPxLPBase<double> *)
                                                 CONCAT44(in_stack_fffffffffffff634,
                                                          in_stack_fffffffffffff630),
                                                 in_stack_fffffffffffff62c);
                            SPxOut::
                            debug<soplex::SPxMainSM<double>,_const_char_(&)[73],_int_&,_int_&,_const_double_&,_0>
                                      (in_RDI,(char (*) [73])
                                              "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n"
                                       ,&local_1d0,&local_1d4,pdVar12);
                            operator_new(0x30);
                            local_371 = 1;
                            in_stack_fffffffffffff6f0 = local_18;
                            pdVar12 = SPxLPBase<double>::lower
                                                ((SPxLPBase<double> *)
                                                 CONCAT44(in_stack_fffffffffffff634,
                                                          in_stack_fffffffffffff630),
                                                 in_stack_fffffffffffff62c);
                            in_stack_fffffffffffff6e0 = *pdVar12;
                            in_stack_fffffffffffff6e8 = (SPxLPBase<double> *)local_370;
                            std::shared_ptr<soplex::Tolerances>::shared_ptr
                                      ((shared_ptr<soplex::Tolerances> *)
                                       CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                                       ,(shared_ptr<soplex::Tolerances> *)
                                        CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628
                                                ));
                            FixBoundsPS::FixBoundsPS
                                      (in_stack_fffffffffffff760,
                                       (SPxLPBase<double> *)
                                       CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758)
                                       ,(int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                       (double)in_stack_fffffffffffff748,in_stack_fffffffffffff740);
                            local_371 = 0;
                            std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
                            shared_ptr<soplex::SPxMainSM<double>::FixBoundsPS,void>
                                      ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                                       CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                                       ,(FixBoundsPS *)
                                        CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628
                                                ));
                            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                      ((shared_ptr<soplex::Tolerances> *)0x27a2db);
                            Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                                      ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>
                                        *)CONCAT44(in_stack_fffffffffffff634,
                                                   in_stack_fffffffffffff630),
                                       (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                                       CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628)
                                      );
                            in_stack_fffffffffffff6c8 = local_18;
                            in_stack_fffffffffffff6d4 = local_1d0;
                            in_stack_fffffffffffff6d8 =
                                 SPxLPBase<double>::lower
                                           ((SPxLPBase<double> *)
                                            CONCAT44(in_stack_fffffffffffff634,
                                                     in_stack_fffffffffffff630),
                                            in_stack_fffffffffffff62c);
                            (*(code *)((element_type *)
                                      (in_stack_fffffffffffff6c8->super_PostStep)._vptr_PostStep)[5]
                                      .s_epsilon)
                                      (in_stack_fffffffffffff6c8,in_stack_fffffffffffff6d4,
                                       in_stack_fffffffffffff6d8,0);
                            std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                                      ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x27a35a);
                          }
                        }
                        else {
                          in_stack_fffffffffffff780 =
                               (SPxMainSM<double> *)
                               SPxLPBase<double>::upper
                                         ((SPxLPBase<double> *)
                                          CONCAT44(in_stack_fffffffffffff634,
                                                   in_stack_fffffffffffff630),
                                          in_stack_fffffffffffff62c);
                          in_stack_fffffffffffff778 =
                               (SPxLPBase<double> *)
                               (in_stack_fffffffffffff780->super_SPxSimplifier<double>).
                               _vptr_SPxSimplifier;
                          pdVar12 = (double *)infinity();
                          if (*pdVar12 <= (double)in_stack_fffffffffffff778) {
                            SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[23],_0>
                                      (in_RDI,(char (*) [23])"IMAISM77 LP unbounded\n");
                            local_4 = UNBOUNDED;
                            local_370._156_4_ = 1;
                            goto LAB_0027ab5c;
                          }
                          in_stack_fffffffffffff770 =
                               SPxLPBase<double>::upper
                                         ((SPxLPBase<double> *)
                                          CONCAT44(in_stack_fffffffffffff634,
                                                   in_stack_fffffffffffff630),
                                          in_stack_fffffffffffff62c);
                          SPxOut::
                          debug<soplex::SPxMainSM<double>,_const_char_(&)[75],_int_&,_int_&,_const_double_&,_0>
                                    (in_RDI,(char (*) [75])
                                            "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n"
                                     ,&local_1d0,&local_1d4,in_stack_fffffffffffff770);
                          operator_new(0x30);
                          local_370[0x27] = 1;
                          in_stack_fffffffffffff750 = local_18;
                          in_stack_fffffffffffff75c = local_1d0;
                          in_stack_fffffffffffff760 =
                               (FixBoundsPS *)
                               SPxLPBase<double>::upper
                                         ((SPxLPBase<double> *)
                                          CONCAT44(in_stack_fffffffffffff634,
                                                   in_stack_fffffffffffff630),
                                          in_stack_fffffffffffff62c);
                          in_stack_fffffffffffff740 =
                               (shared_ptr<soplex::Tolerances> *)
                               (in_stack_fffffffffffff760->super_PostStep)._vptr_PostStep;
                          in_stack_fffffffffffff748 = local_370 + 0x28;
                          std::shared_ptr<soplex::Tolerances>::shared_ptr
                                    ((shared_ptr<soplex::Tolerances> *)
                                     CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                     (shared_ptr<soplex::Tolerances> *)
                                     CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                          FixBoundsPS::FixBoundsPS
                                    (in_stack_fffffffffffff760,
                                     (SPxLPBase<double> *)
                                     CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                                     (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                     (double)in_stack_fffffffffffff748,in_stack_fffffffffffff740);
                          local_370[0x27] = 0;
                          std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
                          shared_ptr<soplex::SPxMainSM<double>::FixBoundsPS,void>
                                    ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                                     CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                     (FixBoundsPS *)
                                     CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                    ((shared_ptr<soplex::Tolerances> *)0x279ff8);
                          Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                                    ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *
                                     )CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                     (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                                     CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                          pDVar6 = local_18;
                          iVar8 = local_1d0;
                          pdVar12 = SPxLPBase<double>::upper
                                              ((SPxLPBase<double> *)
                                               CONCAT44(in_stack_fffffffffffff634,
                                                        in_stack_fffffffffffff630),
                                               in_stack_fffffffffffff62c);
                          (*(code *)((element_type *)(pDVar6->super_PostStep)._vptr_PostStep)[4].
                                    s_floating_point_feastol)(pDVar6,iVar8,pdVar12,0);
                          std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                                    ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x27a077);
                        }
                      }
                    }
                    else if (((double)local_1f0 <= 0.0) || (local_1f8 <= 0.0)) {
                      if (((double)local_1f0 < 0.0) && (local_1f8 < 0.0)) {
                        pdVar12 = SPxLPBase<double>::lower
                                            ((SPxLPBase<double> *)
                                             CONCAT44(in_stack_fffffffffffff634,
                                                      in_stack_fffffffffffff630),
                                             in_stack_fffffffffffff62c);
                        dVar1 = *pdVar12;
                        pdVar12 = (double *)infinity();
                        if (dVar1 <= -*pdVar12) {
                          SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[23],_0>
                                    (in_RDI,(char (*) [23])"IMAISM76 LP unbounded\n");
                          local_4 = UNBOUNDED;
                          local_370._156_4_ = 1;
                          goto LAB_0027ab5c;
                        }
                        pdVar12 = SPxLPBase<double>::lower
                                            ((SPxLPBase<double> *)
                                             CONCAT44(in_stack_fffffffffffff634,
                                                      in_stack_fffffffffffff630),
                                             in_stack_fffffffffffff62c);
                        SPxOut::
                        debug<soplex::SPxMainSM<double>,_const_char_(&)[73],_int_&,_int_&,_const_double_&,_0>
                                  (in_RDI,(char (*) [73])
                                          "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n"
                                   ,&local_1d0,&local_1d4,pdVar12);
                        operator_new(0x30);
                        local_370[0x4f] = 1;
                        SPxLPBase<double>::lower
                                  ((SPxLPBase<double> *)
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   in_stack_fffffffffffff62c);
                        std::shared_ptr<soplex::Tolerances>::shared_ptr
                                  ((shared_ptr<soplex::Tolerances> *)
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   (shared_ptr<soplex::Tolerances> *)
                                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                        FixBoundsPS::FixBoundsPS
                                  (in_stack_fffffffffffff760,
                                   (SPxLPBase<double> *)
                                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                                   (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                   (double)in_stack_fffffffffffff748,in_stack_fffffffffffff740);
                        local_370[0x4f] = 0;
                        std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
                        shared_ptr<soplex::SPxMainSM<double>::FixBoundsPS,void>
                                  ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   (FixBoundsPS *)
                                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                        std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                  ((shared_ptr<soplex::Tolerances> *)0x279cde);
                        Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                                  ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                        pDVar6 = local_18;
                        iVar8 = local_1d0;
                        pdVar12 = SPxLPBase<double>::lower
                                            ((SPxLPBase<double> *)
                                             CONCAT44(in_stack_fffffffffffff634,
                                                      in_stack_fffffffffffff630),
                                             in_stack_fffffffffffff62c);
                        (*(code *)((element_type *)(pDVar6->super_PostStep)._vptr_PostStep)[5].
                                  s_epsilon)(pDVar6,iVar8,pdVar12,0);
                        std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                                  ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x279d5d);
                      }
                    }
                    else {
                      pdVar12 = SPxLPBase<double>::upper
                                          ((SPxLPBase<double> *)
                                           CONCAT44(in_stack_fffffffffffff634,
                                                    in_stack_fffffffffffff630),
                                           in_stack_fffffffffffff62c);
                      dVar1 = *pdVar12;
                      pdVar12 = (double *)infinity();
                      if (*pdVar12 <= dVar1) {
                        SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[23],_0>
                                  (in_RDI,(char (*) [23])"IMAISM75 LP unbounded\n");
                        local_4 = UNBOUNDED;
                        local_370._156_4_ = 1;
                        goto LAB_0027ab5c;
                      }
                      pdVar12 = SPxLPBase<double>::upper
                                          ((SPxLPBase<double> *)
                                           CONCAT44(in_stack_fffffffffffff634,
                                                    in_stack_fffffffffffff630),
                                           in_stack_fffffffffffff62c);
                      SPxOut::
                      debug<soplex::SPxMainSM<double>,_const_char_(&)[73],_int_&,_int_&,_const_double_&,_0>
                                (in_RDI,(char (*) [73])
                                        "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n"
                                 ,&local_1d0,&local_1d4,pdVar12);
                      operator_new(0x30);
                      local_370[0x77] = 1;
                      SPxLPBase<double>::upper
                                ((SPxLPBase<double> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                 in_stack_fffffffffffff62c);
                      std::shared_ptr<soplex::Tolerances>::shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                 (shared_ptr<soplex::Tolerances> *)
                                 CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                      FixBoundsPS::FixBoundsPS
                                (in_stack_fffffffffffff760,
                                 (SPxLPBase<double> *)
                                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                                 (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                 (double)in_stack_fffffffffffff748,in_stack_fffffffffffff740);
                      local_370[0x77] = 0;
                      std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
                      shared_ptr<soplex::SPxMainSM<double>::FixBoundsPS,void>
                                ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                 (FixBoundsPS *)
                                 CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x2799ff);
                      Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                                ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
                                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                 (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                                 CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                      pDVar6 = local_18;
                      iVar8 = local_1d0;
                      pdVar12 = SPxLPBase<double>::upper
                                          ((SPxLPBase<double> *)
                                           CONCAT44(in_stack_fffffffffffff634,
                                                    in_stack_fffffffffffff630),
                                           in_stack_fffffffffffff62c);
                      (*(code *)((element_type *)(pDVar6->super_PostStep)._vptr_PostStep)[4].
                                s_floating_point_feastol)(pDVar6,iVar8,pdVar12,0);
                      std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                                ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x279a7e);
                    }
                    in_stack_fffffffffffff6c0 =
                         SPxLPBase<double>::lower
                                   ((SPxLPBase<double> *)
                                    CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                    in_stack_fffffffffffff62c);
                    SPxLPBase<double>::upper
                              ((SPxLPBase<double> *)
                               CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                               in_stack_fffffffffffff62c);
                    feastol(in_stack_fffffffffffff650);
                    bVar7 = EQrel<double,double,double>
                                      ((double)CONCAT44(in_stack_fffffffffffff634,
                                                        in_stack_fffffffffffff630),
                                       (double)CONCAT44(in_stack_fffffffffffff62c,
                                                        in_stack_fffffffffffff628),
                                       1.28358897074895e-317);
                    if (bVar7) {
                      pbVar16 = DataArray<bool>::operator[](&local_138,local_1d0);
                      *pbVar16 = true;
                      pbVar16 = DataArray<bool>::operator[](&local_150,local_1d0);
                      *pbVar16 = true;
                      piVar11 = DataArray<int>::operator[](&in_RDI->m_stat,0xd);
                      *piVar11 = *piVar11 + 1;
                    }
                  }
                }
                local_1cc = local_1cc + 1;
              }
              local_1c8 = local_1c8 + 1;
            }
          }
        }
      }
      local_378 = 0;
      while( true ) {
        iVar8 = local_378;
        iVar9 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x27a54c);
        n = (int)((ulong)in_stack_fffffffffffff668 >> 0x20);
        if (iVar9 <= iVar8) break;
        pbVar16 = DataArray<bool>::operator[](&local_150,local_378);
        if ((*pbVar16 & 1U) != 0) {
          fixColumn(in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                    (int)((ulong)in_stack_fffffffffffff770 >> 0x20),
                    SUB81((ulong)in_stack_fffffffffffff770 >> 0x18,0));
        }
        local_378 = local_378 + 1;
      }
      local_37c = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x27a5bb);
      local_388 = 0;
      spx_alloc<int*>((int **)in_stack_fffffffffffff670,n);
      for (local_38c = 0; local_38c < local_37c; local_38c = local_38c + 1) {
        pbVar16 = DataArray<bool>::operator[](&local_138,local_38c);
        if ((*pbVar16 & 1U) == 0) {
          *(undefined4 *)(local_388 + (long)local_38c * 4) = 0;
        }
        else {
          *(undefined4 *)(local_388 + (long)local_38c * 4) = 0xffffffff;
          local_24 = local_24 + 1;
          pSVar17 = SPxLPBase<double>::colVector
                              ((SPxLPBase<double> *)
                               CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                               in_stack_fffffffffffff62c);
          iVar8 = SVectorBase<double>::size(pSVar17);
          local_28 = iVar8 + local_28;
        }
      }
      (*(code *)((element_type *)(local_18->super_PostStep)._vptr_PostStep)[2].s_opttol)
                (local_18,local_388);
      for (local_390 = 0; local_390 < local_37c; local_390 = local_390 + 1) {
        if (-1 < *(int *)(local_388 + (long)local_390 * 4)) {
          piVar11 = DataArray<int>::operator[](&in_RDI->m_cIdx,local_390);
          iVar8 = *piVar11;
          piVar11 = DataArray<int>::operator[]
                              (&in_RDI->m_cIdx,*(int *)(local_388 + (long)local_390 * 4));
          *piVar11 = iVar8;
        }
      }
      DataArray<int>::DataArray
                ((DataArray<int> *)in_stack_fffffffffffff640,in_stack_fffffffffffff63c,
                 in_stack_fffffffffffff638,
                 (Real)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      for (local_3ac = 0; uVar20 = (undefined2)((ulong)in_stack_fffffffffffff6c0 >> 0x30),
          local_3ac < local_37c; local_3ac = local_3ac + 1) {
        iVar8 = *(int *)(local_388 + (long)local_3ac * 4);
        piVar11 = DataArray<int>::operator[](&local_3a8,local_3ac);
        *piVar11 = iVar8;
      }
      if ((local_161 & 1) != 0) {
        operator_new(0x78);
        local_3e9 = 1;
        DataArray<int>::DataArray
                  ((DataArray<int> *)in_stack_fffffffffffff640,
                   (DataArray<int> *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
        std::shared_ptr<soplex::Tolerances>::shared_ptr
                  ((shared_ptr<soplex::Tolerances> *)
                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                   (shared_ptr<soplex::Tolerances> *)
                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        in_stack_fffffffffffff630 = 1;
        in_stack_fffffffffffff628 = 0;
        DuplicateColsPS::DuplicateColsPS
                  (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                   (int)((ulong)in_stack_fffffffffffff6e0 >> 0x20),
                   SUB84(in_stack_fffffffffffff6e0,0),(double)in_stack_fffffffffffff6d8,
                   (DataArray<int> *)CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),
                   (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff6c8,
                   SUB21((ushort)uVar20 >> 8,0),SUB21(uVar20,0));
        local_3e9 = 0;
        std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
        shared_ptr<soplex::SPxMainSM<double>::DuplicateColsPS,void>
                  ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                   (DuplicateColsPS *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628))
        ;
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x27a8b1)
        ;
        DataArray<int>::~DataArray
                  ((DataArray<int> *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
        Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                  ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                   (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                   CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                  ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x27a8e9);
      }
      spx_free<int*>((int **)0x27a99e);
      if (0 < local_24) {
        (in_RDI->super_SPxSimplifier<double>).m_remCols =
             local_24 + (in_RDI->super_SPxSimplifier<double>).m_remCols;
        (in_RDI->super_SPxSimplifier<double>).m_remNzos =
             local_28 + (in_RDI->super_SPxSimplifier<double>).m_remNzos;
        if (((in_RDI->super_SPxSimplifier<double>).spxout != (SPxOut *)0x0) &&
           (VVar10 = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout),
           3 < (int)VVar10)) {
          local_3f0 = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout);
          pSVar2 = (in_RDI->super_SPxSimplifier<double>).spxout;
          local_3f4 = 4;
          (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_3f4);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                             ,(char *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628))
          ;
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                             ,in_stack_fffffffffffff62c);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                             ,(char *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628))
          ;
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                             ,in_stack_fffffffffffff62c);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                             ,(char *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628))
          ;
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630)
                             ,(_func_ostream_ptr_ostream_ptr *)
                              CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
          pSVar2 = (in_RDI->super_SPxSimplifier<double>).spxout;
          (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_3f0);
        }
        if ((in_RDI->super_SPxSimplifier<double>).m_minReduction * (double)local_37c <
            (double)local_24) {
          *local_20 = 1;
        }
      }
      local_4 = OKAY;
      local_370._156_4_ = 1;
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
LAB_0027ab5c:
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      DataArray<bool>::~DataArray
                ((DataArray<bool> *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      DataArray<bool>::~DataArray
                ((DataArray<bool> *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      IdxSet::~IdxSet((IdxSet *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      Array<double>::~Array((Array<double> *)0x27ab9d);
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
    }
  }
  return local_4;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}